

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op_keepdims<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int i_1;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int q_1;
  uint uVar15;
  ulong uVar16;
  int q;
  uint _w;
  float fVar17;
  int local_d0;
  Mat sums;
  Mat local_78;
  void *local_38;
  
  sVar1 = a->elemsize;
  iVar8 = a->dims;
  if (iVar8 == 3) {
    uVar4 = a->w;
    lVar11 = (long)(int)uVar4;
    uVar15 = a->h;
    _w = a->c;
    uVar14 = uVar15 * uVar4;
    bVar3 = !reduce_h;
    if ((reduce_w && !bVar3) && reduce_c) {
      Mat::create(b,1,1,1,sVar1,opt->blob_allocator);
      Mat::Mat(&sums,_w,sVar1,opt->workspace_allocator);
      local_d0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar6 = 0;
        uVar16 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar16 = uVar6;
        }
        uVar12 = (ulong)_w;
        if ((int)_w < 1) {
          uVar12 = uVar6;
        }
        for (; uVar6 != uVar12; uVar6 = uVar6 + 1) {
          Mat::channel(&local_78,a,(int)uVar6);
          pvVar5 = local_78.data;
          Mat::~Mat(&local_78);
          fVar17 = 0.0;
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            fVar17 = fVar17 + *(float *)((long)pvVar5 + uVar13 * 4);
          }
          *(float *)((long)sums.data + uVar6 * 4) = fVar17;
        }
        fVar17 = 0.0;
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          fVar17 = fVar17 + *(float *)((long)sums.data + uVar16 * 4);
        }
        *(float *)b->data = fVar17;
        local_d0 = 0;
      }
    }
    else {
      if ((reduce_w && !bVar3) && !reduce_c) {
        Mat::create(b,1,1,_w,sVar1,opt->blob_allocator);
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        if ((int)_w < 1) {
          _w = 0;
        }
        for (uVar4 = 0; uVar4 != _w; uVar4 = uVar4 + 1) {
          Mat::channel(&sums,a,uVar4);
          pvVar5 = sums.data;
          Mat::~Mat(&sums);
          Mat::channel(&sums,b,uVar4);
          pvVar9 = sums.data;
          Mat::~Mat(&sums);
          fVar17 = 0.0;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            fVar17 = fVar17 + *(float *)((long)pvVar5 + uVar16 * 4);
          }
          *(float *)pvVar9 = fVar17;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar15,_w,sVar1,opt->blob_allocator);
        uVar16 = 0;
        if (0 < (int)uVar4) {
          uVar16 = (ulong)uVar4;
        }
        uVar6 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar6 = 0;
        }
        uVar12 = (ulong)_w;
        if ((int)_w < 1) {
          uVar12 = 0;
        }
        iVar8 = 0;
        while (iVar8 != (int)uVar12) {
          Mat::channel(&sums,a,iVar8);
          pvVar5 = sums.data;
          Mat::~Mat(&sums);
          local_38 = (void *)CONCAT44(local_38._4_4_,iVar8);
          Mat::channel(&sums,b,iVar8);
          pvVar9 = sums.data;
          Mat::~Mat(&sums);
          for (uVar13 = 0; uVar13 != uVar6; uVar13 = uVar13 + 1) {
            fVar17 = 0.0;
            for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
              fVar17 = fVar17 + *(float *)((long)pvVar5 + uVar7 * 4);
            }
            *(float *)((long)pvVar9 + uVar13 * 4) = fVar17;
            pvVar5 = (void *)((long)pvVar5 + lVar11 * 4);
          }
          iVar8 = (int)local_38 + 1;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar15,1,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar15,_w,sVar1,opt->workspace_allocator);
        local_d0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar6 = 0;
          uVar16 = 0;
          if (0 < (int)uVar4) {
            uVar16 = (ulong)uVar4;
          }
          uVar12 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar12 = uVar6;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar6 != _w; uVar6 = uVar6 + 1) {
            Mat::channel(&local_78,a,(int)uVar6);
            pvVar5 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar9 = (void *)(sums.cstep * uVar6 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            local_78.data = pvVar9;
            Mat::~Mat(&local_78);
            for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
              fVar17 = 0.0;
              for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
                fVar17 = fVar17 + *(float *)((long)pvVar5 + uVar7 * 4);
              }
              *(float *)((long)pvVar9 + uVar13 * 4) = fVar17;
              pvVar5 = (void *)((long)pvVar5 + lVar11 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_d0 = 0;
          for (uVar16 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar5 = sums.data,
              uVar16 != _w; uVar16 = uVar16 + 1) {
            local_78.data = (void *)(sums.cstep * uVar16 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_78);
            pvVar9 = b->data;
            for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar9 + uVar6 * 4) =
                   *(float *)((long)pvVar5 + uVar6 * 4 + sVar2 * sVar1 * uVar16) +
                   *(float *)((long)pvVar9 + uVar6 * 4);
            }
          }
        }
      }
      else {
        if ((bVar3 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar4,uVar15,1,sVar1,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar16 = (ulong)uVar14;
            if ((int)uVar14 < 1) {
              uVar16 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar4 = 0; uVar4 != _w; uVar4 = uVar4 + 1) {
              Mat::channel(&sums,a,uVar4);
              pvVar9 = sums.data;
              Mat::~Mat(&sums);
              pvVar5 = b->data;
              for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar5 + uVar6 * 4) =
                     *(float *)((long)pvVar9 + uVar6 * 4) + *(float *)((long)pvVar5 + uVar6 * 4);
              }
            }
            return 0;
          }
          if ((bVar3 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar4,1,_w,sVar1,opt->blob_allocator);
          Mat::fill(b,0.0);
          uVar16 = 0;
          if (0 < (int)uVar4) {
            uVar16 = (ulong)uVar4;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          uVar4 = 0;
          while (uVar4 != _w) {
            Mat::channel(&sums,a,uVar4);
            pvVar5 = sums.data;
            Mat::~Mat(&sums);
            local_38 = (void *)CONCAT44(local_38._4_4_,uVar4);
            Mat::channel(&sums,b,uVar4);
            pvVar9 = sums.data;
            Mat::~Mat(&sums);
            for (uVar4 = 0; uVar4 != uVar15; uVar4 = uVar4 + 1) {
              for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar9 + uVar6 * 4) =
                     *(float *)((long)pvVar5 + uVar6 * 4) + *(float *)((long)pvVar9 + uVar6 * 4);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar11 * 4);
            }
            uVar4 = (int)local_38 + 1;
          }
          return 0;
        }
        Mat::create(b,uVar4,1,1,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,uVar4,1,_w,sVar1,opt->workspace_allocator);
        local_d0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar16 = 0;
          uVar6 = 0;
          if (0 < (int)uVar4) {
            uVar6 = (ulong)uVar4;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          uVar12 = (ulong)_w;
          if ((int)_w < 1) {
            uVar12 = uVar16;
          }
          for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
            Mat::channel(&local_78,a,(int)uVar16);
            pvVar5 = local_78.data;
            Mat::~Mat(&local_78);
            sVar2 = sums.cstep;
            sVar1 = sums.elemsize;
            local_38 = sums.data;
            local_78.data = (void *)(sums.cstep * uVar16 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_78);
            lVar10 = sVar2 * sVar1 * uVar16;
            for (uVar4 = 0; uVar4 != uVar15; uVar4 = uVar4 + 1) {
              for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
                *(float *)((long)local_38 + uVar13 * 4 + lVar10) =
                     *(float *)((long)pvVar5 + uVar13 * 4) +
                     *(float *)((long)local_38 + uVar13 * 4 + lVar10);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar11 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_d0 = 0;
          for (uVar16 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar5 = sums.data,
              uVar16 != uVar12; uVar16 = uVar16 + 1) {
            local_78.data = (void *)(sums.cstep * uVar16 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_78);
            pvVar9 = b->data;
            for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
              *(float *)((long)pvVar9 + uVar13 * 4) =
                   *(float *)((long)pvVar5 + uVar13 * 4 + sVar2 * sVar1 * uVar16) +
                   *(float *)((long)pvVar9 + uVar13 * 4);
            }
          }
        }
      }
    }
LAB_00140a70:
    Mat::~Mat(&sums);
  }
  else {
    if (iVar8 == 2) {
      uVar4 = a->w;
      uVar15 = a->h;
      if (reduce_w && reduce_h) {
        Mat::create(b,1,1,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,uVar15,sVar1,opt->workspace_allocator);
        local_d0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pvVar5 = a->data;
          iVar8 = a->w;
          uVar6 = 0;
          uVar16 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar16 = uVar6;
          }
          uVar12 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar12 = uVar6;
          }
          sVar1 = a->elemsize;
          for (; fVar17 = 0.0, uVar6 != uVar12; uVar6 = uVar6 + 1) {
            for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
              fVar17 = fVar17 + *(float *)((long)pvVar5 + uVar13 * 4);
            }
            *(float *)((long)sums.data + uVar6 * 4) = fVar17;
            pvVar5 = (void *)((long)pvVar5 + (long)iVar8 * sVar1);
          }
          for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
            fVar17 = fVar17 + *(float *)((long)sums.data + uVar16 * 4);
          }
          *(float *)b->data = fVar17;
          local_d0 = 0;
        }
        goto LAB_00140a70;
      }
      if (reduce_w && !reduce_h) {
        Mat::create(b,1,uVar15,sVar1,opt->blob_allocator);
        pvVar5 = a->data;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        iVar8 = a->w;
        uVar16 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar16 = 0;
        }
        pvVar9 = b->data;
        sVar1 = a->elemsize;
        for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
          fVar17 = 0.0;
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar17 = fVar17 + *(float *)((long)pvVar5 + uVar12 * 4);
          }
          *(float *)((long)pvVar9 + uVar6 * 4) = fVar17;
          pvVar5 = (void *)((long)pvVar5 + (long)iVar8 * sVar1);
        }
      }
      else {
        if (!reduce_h || reduce_w) {
          return 0;
        }
        Mat::create(b,uVar4,1,sVar1,opt->blob_allocator);
        Mat::fill(b,0.0);
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        pvVar5 = a->data;
        uVar16 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar16 = 0;
        }
        iVar8 = a->w;
        sVar1 = a->elemsize;
        for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
          pvVar9 = b->data;
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar9 + uVar12 * 4) =
                 *(float *)((long)pvVar5 + uVar12 * 4) + *(float *)((long)pvVar9 + uVar12 * 4);
          }
          pvVar5 = (void *)((long)pvVar5 + (long)iVar8 * sVar1);
        }
      }
    }
    else {
      if (iVar8 != 1) {
        return 0;
      }
      uVar4 = a->w;
      Mat::create(b,1,sVar1,opt->blob_allocator);
      uVar6 = 0;
      uVar16 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar16 = uVar6;
      }
      fVar17 = 0.0;
      for (; uVar16 != uVar6; uVar6 = uVar6 + 1) {
        fVar17 = fVar17 + *(float *)((long)a->data + uVar6 * 4);
      }
      *(float *)b->data = fVar17;
    }
    local_d0 = 0;
  }
  return local_d0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}